

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

char * ImGui::GetNavInputName(ImGuiNavInput n)

{
  if ((uint)n < 0x14) {
    return _ZZN5ImGui15GetNavInputNameEiE5names_rel +
           *(int *)(_ZZN5ImGui15GetNavInputNameEiE5names_rel + (ulong)(uint)n * 4);
  }
  __assert_fail("n >= 0 && n < ImGuiNavInput_COUNT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                ,0x2789,"const char *ImGui::GetNavInputName(ImGuiNavInput)");
}

Assistant:

const char* ImGui::GetNavInputName(ImGuiNavInput n)
{
    static const char* names[] =
    {
        "Activate", "Cancel", "Input", "Menu", "DpadLeft", "DpadRight", "DpadUp", "DpadDown", "LStickLeft", "LStickRight", "LStickUp", "LStickDown",
        "FocusPrev", "FocusNext", "TweakSlow", "TweakFast", "KeyLeft", "KeyRight", "KeyUp", "KeyDown"
    };
    IM_ASSERT(IM_ARRAYSIZE(names) == ImGuiNavInput_COUNT);
    IM_ASSERT(n >= 0 && n < ImGuiNavInput_COUNT);
    return names[n];
}